

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

string_view __thiscall
wabt::anon_unknown_15::BinaryReaderObjdumpBase::GetSymbolName
          (BinaryReaderObjdumpBase *this,Index symbol_index)

{
  pointer pOVar1;
  ulong uVar2;
  string_view sVar3;
  
  uVar2 = (ulong)symbol_index;
  pOVar1 = (this->objdump_state_->symtab).
           super__Vector_base<wabt::ObjdumpSymbol,_std::allocator<wabt::ObjdumpSymbol>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar2 < (ulong)(((long)(this->objdump_state_->symtab).
                             super__Vector_base<wabt::ObjdumpSymbol,_std::allocator<wabt::ObjdumpSymbol>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar1) / 0x30)) {
    switch(pOVar1[uVar2].kind) {
    case Function:
      sVar3 = GetFunctionName(this,pOVar1[uVar2].index);
      break;
    case Data:
      sVar3._M_str = pOVar1[uVar2].name._M_dataplus._M_p;
      sVar3._M_len = pOVar1[uVar2].name._M_string_length;
      break;
    case Global:
      sVar3 = GetGlobalName(this,pOVar1[uVar2].index);
      break;
    case Section:
      sVar3 = GetSectionName(this,pOVar1[uVar2].index);
      break;
    case Tag:
      sVar3 = GetTagName(this,pOVar1[uVar2].index);
      break;
    case Table:
      sVar3 = GetTableName(this,pOVar1[uVar2].index);
      break;
    default:
      abort();
    }
  }
  else {
    sVar3._M_str = "<illegal_symbol_index>";
    sVar3._M_len = 0x16;
  }
  return sVar3;
}

Assistant:

std::string_view BinaryReaderObjdumpBase::GetSymbolName(
    Index symbol_index) const {
  if (symbol_index >= objdump_state_->symtab.size())
    return "<illegal_symbol_index>";
  ObjdumpSymbol& sym = objdump_state_->symtab[symbol_index];
  switch (sym.kind) {
    case SymbolType::Function:
      return GetFunctionName(sym.index);
    case SymbolType::Data:
      return sym.name;
    case SymbolType::Global:
      return GetGlobalName(sym.index);
    case SymbolType::Section:
      return GetSectionName(sym.index);
    case SymbolType::Tag:
      return GetTagName(sym.index);
    case SymbolType::Table:
      return GetTableName(sym.index);
  }
  WABT_UNREACHABLE;
}